

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

bool __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::Contains(S2ShapeIndexRegion<S2ShapeIndex> *this,S2Point *p)

{
  Iterator *it;
  bool bVar1;
  int iVar2;
  S2ShapeIndexCell *this_00;
  S2ClippedShape *clipped;
  int local_2c;
  int s;
  S2ShapeIndexCell *cell;
  S2Point *p_local;
  S2ShapeIndexRegion<S2ShapeIndex> *this_local;
  
  bVar1 = S2ShapeIndex::Iterator::Locate(this->iter_,p);
  if (bVar1) {
    this_00 = S2ShapeIndex::Iterator::cell(this->iter_);
    for (local_2c = 0; iVar2 = S2ShapeIndexCell::num_clipped(this_00), local_2c < iVar2;
        local_2c = local_2c + 1) {
      it = this->iter_;
      clipped = S2ShapeIndexCell::clipped(this_00,local_2c);
      bVar1 = S2ContainsPointQuery<S2ShapeIndex>::ShapeContains(&this->contains_query_,it,clipped,p)
      ;
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::Contains(const S2Point& p) const {
  if (iter_.Locate(p)) {
    const S2ShapeIndexCell& cell = iter_.cell();
    for (int s = 0; s < cell.num_clipped(); ++s) {
      if (contains_query_.ShapeContains(iter_, cell.clipped(s), p)) {
        return true;
      }
    }
  }
  return false;
}